

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web.cpp
# Opt level: O2

void __thiscall Output_Port::Destroy(Output_Port *this,Am_Constraint *self)

{
  bool bVar1;
  Am_Constraint *pAVar2;
  Am_Constraint_Tag constraint_tag;
  Am_Slot slot;
  Am_Constraint_Iterator iter;
  
  slot.data = (this->context).data;
  (this->context).data = (Am_Slot_Data *)0x0;
  if (this->next != (Output_Port *)0x0) {
    Destroy(this->next,self);
    this->next = (Output_Port *)0x0;
  }
  Am_Constraint_Iterator::Am_Constraint_Iterator(&iter,&slot);
  Am_Constraint_Iterator::Start(&iter);
  do {
    bVar1 = Am_Constraint_Iterator::Last(&iter);
    if (bVar1) {
LAB_001d9c43:
      operator_delete(this,0x10);
      return;
    }
    pAVar2 = Am_Constraint_Iterator::Get(&iter);
    if (pAVar2 == self) {
      constraint_tag = Am_Constraint_Iterator::Get_Tag(&iter);
      Am_Slot::Remove_Constraint(&slot,constraint_tag);
      goto LAB_001d9c43;
    }
    Am_Constraint_Iterator::Next(&iter);
  } while( true );
}

Assistant:

void Destroy(Am_Constraint *self)
  {
    Am_Slot slot = context;
    context = (Am_Slot_Data *)nullptr;
    if (next) {
      next->Destroy(self);
      next = nullptr;
    }
    Am_Constraint_Iterator iter(slot);
    Am_Constraint *curr;
    for (iter.Start(); !iter.Last(); iter.Next()) {
      curr = iter.Get();
      if (curr == self) {
        Am_Constraint_Tag tag = iter.Get_Tag();
        slot.Remove_Constraint(tag);
        break;
      }
    }
    delete this;
  }